

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O3

int build_dd(DdManager *table,int num,int lower,int upper)

{
  int *piVar1;
  int iVar2;
  int x;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int index;
  int local_34;
  
  if ((computed == (st__table *)0x0) ||
     (iVar2 = st__lookup_int(computed,(char *)(storedd + (long)num * ((long)numvars + 1)),&local_34)
     , iVar2 == 0)) {
    uVar4 = (ulong)numvars;
    if (0 < (long)uVar4) {
      iVar2 = storedd[uVar4];
      iVar9 = 0;
      do {
        iVar7 = table->perm[storedd[((int)uVar4 + 1) * num + iVar9]];
        while (x = cuddNextLow(table,iVar7), iVar9 + lower <= x) {
          iVar3 = cuddSwapInPlace(table,x,iVar7);
          iVar7 = x;
          if (iVar3 == 0) {
            return 0;
          }
        }
        if (iVar2 * 0x14 < (int)(table->keys - table->isolated)) break;
        iVar9 = iVar9 + 1;
        uVar4 = (ulong)(uint)numvars;
      } while (iVar9 < numvars);
    }
    iVar9 = cuddSifting(table,lower,upper);
    piVar5 = storedd;
    iVar2 = numvars;
    if (iVar9 == 0) {
      return 0;
    }
    lVar6 = (long)numvars;
    iVar9 = (numvars + 1) * num;
    if (0 < lVar6) {
      piVar1 = table->invperm;
      lVar8 = 0;
      do {
        piVar5[iVar9 + lVar8] = piVar1[lower + lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar6 != lVar8);
    }
    iVar7 = table->keys - table->isolated;
    iVar2 = iVar2 + iVar9;
  }
  else {
    iVar7 = storedd[local_34 * (numvars + 1) + numvars];
    iVar2 = num * (numvars + 1) + numvars;
    piVar5 = storedd;
  }
  piVar5[iVar2] = iVar7;
  return 1;
}

Assistant:

static int
build_dd(
  DdManager * table,
  int  num /* the index of the individual to be built */,
  int  lower,
  int  upper)
{
    int         i,j;            /* loop vars */
    int         position;
    int         index;
    int         limit;          /* how large the DD for this order can grow */
    int         size;

    /* Check the computed table. If the order already exists, it
    ** suffices to copy the size from the existing entry.
    */
    if (computed && st__lookup_int(computed,(char *)&STOREDD(num,0),&index)) {
        STOREDD(num,numvars) = STOREDD(index,numvars);
#ifdef DD_STATS
        (void) fprintf(table->out,"\nCache hit for index %d", index);
#endif
        return(1);
    }

    /* Stop if the DD grows 20 times larges than the reference size. */
    limit = 20 * STOREDD(0,numvars);

    /* Sift up the variables so as to build the desired permutation.
    ** First the variable that has to be on top is sifted to the top.
    ** Then the variable that has to occupy the secon position is sifted
    ** up to the second position, and so on.
    */
    for (j = 0; j < numvars; j++) {
        i = STOREDD(num,j);
        position = table->perm[i];
        result = sift_up(table,position,j+lower);
        if (!result) return(0);
        size = table->keys - table->isolated;
        if (size > limit) break;
    }

    /* Sift the DD just built. */
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    result = cuddSifting(table,lower,upper);
    if (!result) return(0);

    /* Copy order and size to table. */
    for (j = 0; j < numvars; j++) {
        STOREDD(num,j) = table->invperm[lower+j];
    }
    STOREDD(num,numvars) = table->keys - table->isolated; /* size of new DD */
    return(1);

}